

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestAllTypesLite_OptionalGroup::_InternalSerialize
          (TestAllTypesLite_OptionalGroup *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  void *data;
  bool bVar1;
  ulong uVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  ulong uVar5;
  
  if ((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) !=
      (undefined1  [12])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = (ulong)(this->field_0)._impl_.a_;
    pbVar3 = target + 2;
    target[0] = 0x88;
    target[1] = '\x01';
    uVar2 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar3 = (byte)uVar2 | 0x80;
        uVar5 = uVar2 >> 7;
        pbVar3 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar2;
        uVar2 = uVar5;
      } while (bVar1);
    }
    *pbVar3 = (byte)uVar5;
    target = pbVar3 + 1;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = uVar2 & 0xfffffffffffffffe;
    data = *(void **)(uVar2 + 8);
    size = *(uint *)(uVar2 + 0x10);
    if ((long)stream->end_ - (long)target < (long)(int)size) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar4;
    }
    memcpy(target,data,(ulong)size);
    target = target + (int)size;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestAllTypesLite_OptionalGroup::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestAllTypesLite_OptionalGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestAllTypesLite.OptionalGroup)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 a = 17;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        17, this_._internal_a(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestAllTypesLite.OptionalGroup)
  return target;
}